

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O0

void __thiscall
hedg::params::login::login(login *this,string *username_,string *password_,string *endpoint_)

{
  string *endpoint__local;
  string *password__local;
  string *username__local;
  login *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)username_);
  std::__cxx11::string::string((string *)&this->password,(string *)password_);
  std::__cxx11::string::string((string *)&this->endpoint,(string *)endpoint_);
  return;
}

Assistant:

login::login(std::string username_, std::string password_, std::string endpoint_)
		:username{ username_ }, password{ password_ }, endpoint{ endpoint_ } {}